

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

void parse_error(char *str)

{
  long lVar1;
  char *str_local;
  
  lVar1 = ftell((FILE *)loginfo.flog);
  raw_printf("Error at file position: %ld\n",lVar1,str);
  loginfo.cmds_are_invalid = '\x01';
  terminate();
}

Assistant:

static void NORETURN parse_error(const char *str)
{
#ifdef DEBUG
    raw_printf("Error at file position: %ld\n", ftell(loginfo.flog), str);
#else
    raw_printf("The command log seems to be in an outdated format.  "
	       "The game will be replayed from diffs instead.");
#endif
    loginfo.cmds_are_invalid = TRUE;
    terminate();
}